

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump2XYZCmd.cpp
# Opt level: O0

int cmdline_parser2(int argc,char **argv,gengetopt_args_info *args_info,int override,int initialize,
                   int check_required)

{
  int iVar1;
  cmdline_parser_params params;
  int result;
  char *in_stack_00000270;
  cmdline_parser_params *in_stack_00000278;
  gengetopt_args_info *in_stack_00000280;
  char **in_stack_00000288;
  int in_stack_00000290;
  
  iVar1 = cmdline_parser_internal
                    (in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278,
                     in_stack_00000270);
  return iVar1;
}

Assistant:

int
cmdline_parser2 (int argc, char **argv, struct gengetopt_args_info *args_info, int override, int initialize, int check_required)
{
  int result;
  struct cmdline_parser_params params;
  
  params.override = override;
  params.initialize = initialize;
  params.check_required = check_required;
  params.check_ambiguity = 0;
  params.print_errors = 1;

  result = cmdline_parser_internal (argc, argv, args_info, &params, 0);

  return result;
}